

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resbund.cpp
# Opt level: O0

Locale * __thiscall icu_63::ResourceBundle::getLocale(ResourceBundle *this)

{
  char *newLanguage;
  Locale *this_00;
  char **status_00;
  Locale *local_80;
  Locale *local_70;
  ResourceBundle *ncThis;
  char *localeName;
  UErrorCode status;
  Mutex lock;
  ResourceBundle *this_local;
  
  lock.fMutex = (UMutex *)this;
  Mutex::Mutex((Mutex *)&status,(UMutex *)gLocaleLock);
  if (this->fLocale == (Locale *)0x0) {
    localeName._0_4_ = 0;
    status_00 = &localeName;
    newLanguage = ures_getLocaleInternal_63(this->fResource,(UErrorCode *)status_00);
    this_00 = (Locale *)UMemory::operator_new((UMemory *)0xe0,(size_t)status_00);
    local_70 = (Locale *)0x0;
    if (this_00 != (Locale *)0x0) {
      Locale::Locale(this_00,newLanguage,(char *)0x0,(char *)0x0,(char *)0x0);
      local_70 = this_00;
    }
    this->fLocale = local_70;
    if (this->fLocale == (Locale *)0x0) {
      local_80 = Locale::getDefault();
    }
    else {
      local_80 = this->fLocale;
    }
    this_local = (ResourceBundle *)local_80;
  }
  else {
    this_local = (ResourceBundle *)this->fLocale;
  }
  localeName._4_4_ = 1;
  Mutex::~Mutex((Mutex *)&status);
  return (Locale *)this_local;
}

Assistant:

const Locale &ResourceBundle::getLocale(void) const {
    Mutex lock(&gLocaleLock);
    if (fLocale != NULL) {
        return *fLocale;
    }
    UErrorCode status = U_ZERO_ERROR;
    const char *localeName = ures_getLocaleInternal(fResource, &status);
    ResourceBundle *ncThis = const_cast<ResourceBundle *>(this);
    ncThis->fLocale = new Locale(localeName);
    return ncThis->fLocale != NULL ? *ncThis->fLocale : Locale::getDefault();
}